

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::NameShadowingChecker::loadBindings(NameShadowingChecker *this,HSQOBJECT *bindings)

{
  SQTable *this_00;
  SymbolInfo *info;
  SQObjectValue SVar1;
  SQObjectValue SVar2;
  Chunk *pCVar3;
  SQObjectPtr key;
  SQObjectPtr pos;
  SQObjectPtr val;
  SQObject local_68;
  SQObjectPtr local_58;
  SQObject local_48;
  
  if ((bindings != (HSQOBJECT *)0x0) && (bindings->_type == OT_TABLE)) {
    this_00 = (bindings->_unVal).pTable;
    local_58.super_SQObject._type = OT_INTEGER;
    local_58.super_SQObject._flags = '\0';
    local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_68._unVal.pTable = (SQTable *)0x0;
    local_68._type = OT_NULL;
    local_68._flags = '\0';
    local_68._5_3_ = 0;
    local_48._unVal.pTable = (SQTable *)0x0;
    local_48._type = OT_NULL;
    local_48._flags = '\0';
    local_48._5_3_ = 0;
    SVar2.pTable = local_58.super_SQObject._unVal.pTable;
    while (local_58.super_SQObject._unVal = SVar2,
          SVar2.nInteger =
               SQTable::Next(this_00,false,&local_58,(SQObjectPtr *)&local_68,
                             (SQObjectPtr *)&local_48), SVar1 = local_68._unVal, -1 < SVar2.nInteger
          ) {
      if (local_68._type == OT_STRING) {
        pCVar3 = Arena::findChunk((this->_ctx)._arena,0x20);
        info = (SymbolInfo *)pCVar3->_ptr;
        pCVar3->_ptr = (uint8_t *)(info + 1);
        (info->declaration).x = (Id *)0x0;
        info->kind = SK_EXTERNAL_BINDING;
        info->ownerScope = (Scope *)0x0;
        info->name = (SQChar *)0x0;
        declareSymbol(this,(SVar1.pString)->_val,info);
      }
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
    SQObjectPtr::~SQObjectPtr(&local_58);
  }
  return;
}

Assistant:

void NameShadowingChecker::loadBindings(const HSQOBJECT *bindings) {
  if (bindings && sq_istable(*bindings)) {
    SQTable *table = _table(*bindings);

    SQInteger idx = 0;
    SQObjectPtr pos(idx), key, val;

    while ((idx = table->Next(false, pos, key, val)) >= 0) {
      if (sq_isstring(key)) {
        const SQChar *s = _string(key)->_val;
        SymbolInfo *info = newSymbolInfo(SK_EXTERNAL_BINDING);
        declareSymbol(s, info);
      }
      pos._unVal.nInteger = idx;
    }
  }
}